

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vline.h
# Opt level: O2

void __thiscall VLine::splitAtLength(VLine *this,float lengthAt,VLine *left,VLine *right)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  fVar5 = length(this);
  fVar3 = this->mX1;
  fVar4 = this->mY1;
  uVar1 = this->mX2;
  uVar2 = this->mY2;
  auVar7._0_4_ = (float)uVar1 - fVar3;
  auVar7._4_4_ = (float)uVar2 - fVar4;
  auVar7._8_8_ = 0;
  auVar8._4_4_ = fVar5;
  auVar8._0_4_ = fVar5;
  auVar8._8_4_ = fVar5;
  auVar8._12_4_ = fVar5;
  auVar8 = divps(auVar7,auVar8);
  fVar5 = lengthAt * auVar8._0_4_ + fVar3;
  fVar6 = lengthAt * auVar8._4_4_ + fVar4;
  left->mX1 = fVar3;
  left->mY1 = fVar4;
  left->mX2 = fVar5;
  left->mY2 = fVar6;
  right->mX1 = fVar5;
  right->mY1 = fVar6;
  fVar3 = this->mY2;
  right->mX2 = this->mX2;
  right->mY2 = fVar3;
  return;
}

Assistant:

inline void VLine::splitAtLength(float lengthAt, VLine &left, VLine &right) const
{
    float  len = length();
    float dx = ((mX2 - mX1) / len) * lengthAt;
    float dy = ((mY2 - mY1) / len) * lengthAt;

    left.mX1 = mX1;
    left.mY1 = mY1;
    left.mX2 = left.mX1 + dx;
    left.mY2 = left.mY1 + dy;

    right.mX1 = left.mX2;
    right.mY1 = left.mY2;
    right.mX2 = mX2;
    right.mY2 = mY2;
}